

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzautopointer.h
# Opt level: O0

TPZAutoPointer<TPZMatrix<double>_>
TPZAutoPointerDynamicCast<TPZMatrix<double>,TPZBaseMatrix>(TPZAutoPointer<TPZBaseMatrix> *in)

{
  undefined8 *in_RSI;
  TPZReference *in_RDI;
  TPZMatrix<double> *p;
  TPZAutoPointer<TPZMatrix<double>_> *rv;
  TPZReference *this;
  long local_58;
  TPZReference *pTVar1;
  
  pTVar1 = in_RDI;
  TPZAutoPointer<TPZMatrix<double>_>::TPZAutoPointer((TPZAutoPointer<TPZMatrix<double>_> *)in_RDI);
  if (*(long *)*in_RSI == 0) {
    local_58 = 0;
  }
  else {
    local_58 = __dynamic_cast(*(long *)*in_RSI,&TPZBaseMatrix::typeinfo,&TPZMatrix<double>::typeinfo
                              ,0);
  }
  if (local_58 != 0) {
    this = (TPZReference *)pTVar1->fPointer;
    if (this != (TPZReference *)0x0) {
      TPZAutoPointer<TPZMatrix<double>_>::TPZReference::~TPZReference(this);
      operator_delete(this,0x10);
    }
    pTVar1->fPointer = (TPZMatrix<double> *)*in_RSI;
    TPZAutoPointer<TPZMatrix<double>_>::TPZReference::Increment((TPZReference *)pTVar1->fPointer);
  }
  return (TPZAutoPointer<TPZMatrix<double>_>)in_RDI;
}

Assistant:

TPZAutoPointer<R> TPZAutoPointerDynamicCast(TPZAutoPointer<T> in) {
    TPZAutoPointer<R> rv;
    if (R* p; (p = dynamic_cast<R*> (in.fRef->fPointer)) ) {
        delete rv.fRef;
        rv.fRef = (typename TPZAutoPointer<R>::TPZReference *) in.fRef;
        rv.fRef->Increment();
    }
    return rv;
}